

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# civetweb.c
# Opt level: O2

int mg_url_encode(char *src,char *dst,size_t dst_len)

{
  byte bVar1;
  ushort **ppuVar2;
  void *pvVar3;
  byte *pbVar4;
  byte *pbVar5;
  int local_38;
  
  pbVar5 = (byte *)dst;
  while( true ) {
    bVar1 = *src;
    if ((bVar1 == 0) || (dst + (dst_len - 1) <= pbVar5)) break;
    ppuVar2 = __ctype_b_loc();
    if (((*ppuVar2)[bVar1] & 8) == 0) {
      pvVar3 = memchr("._-$,;~()",(int)(char)bVar1,10);
      if (pvVar3 != (void *)0x0) goto LAB_00114fb5;
      pbVar4 = pbVar5 + 2;
      if (dst + (dst_len - 1) <= pbVar4) break;
      *pbVar5 = 0x25;
      pbVar5[1] = "0123456789abcdef"[(byte)*src >> 4];
      pbVar5[2] = "0123456789abcdef"[(byte)*src & 0xf];
    }
    else {
LAB_00114fb5:
      *pbVar5 = bVar1;
      pbVar4 = pbVar5;
    }
    src = (char *)((byte *)src + 1);
    pbVar5 = pbVar4 + 1;
  }
  *pbVar5 = 0;
  local_38 = (int)dst;
  return -(uint)(*src != 0) | (int)pbVar5 - local_38;
}

Assistant:

CIVETWEB_API int
mg_url_encode(const char *src, char *dst, size_t dst_len)
{
	static const char *dont_escape = "._-$,;~()";
	static const char *hex = "0123456789abcdef";
	char *pos = dst;
	const char *end = dst + dst_len - 1;

	for (; ((*src != '\0') && (pos < end)); src++, pos++) {
		if (isalnum((unsigned char)*src)
		    || (strchr(dont_escape, *src) != NULL)) {
			*pos = *src;
		} else if (pos + 2 < end) {
			pos[0] = '%';
			pos[1] = hex[(unsigned char)*src >> 4];
			pos[2] = hex[(unsigned char)*src & 0xf];
			pos += 2;
		} else {
			break;
		}
	}

	*pos = '\0';
	return (*src == '\0') ? (int)(pos - dst) : -1;
}